

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReqInfo.hpp
# Opt level: O2

bool __thiscall
Husky::HttpReqInfo::_parseUrl
          (HttpReqInfo *this,string *url,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mp)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  ulong uVar6;
  mapped_type *this_00;
  uint uVar7;
  int iVar8;
  string local_70 [32];
  key_type local_50;
  
  sVar2 = url->_M_string_length;
  if (sVar2 != 0) {
    uVar6 = std::__cxx11::string::find((char)url,0x3f);
    while (iVar5 = (int)uVar6, uVar3 = url->_M_string_length, iVar5 + 1 < uVar3) {
      pcVar4 = (url->_M_dataplus)._M_p;
      iVar8 = -1;
      do {
        uVar6 = (ulong)(iVar5 + iVar8 + 2);
        if (uVar3 <= uVar6) goto LAB_00117aa7;
        iVar8 = iVar8 + 1;
      } while (pcVar4[uVar6] != '=');
      for (uVar7 = iVar5 + iVar8 + 2;
          ((uVar6 = (ulong)uVar7, uVar6 < uVar3 && (cVar1 = pcVar4[uVar6], cVar1 != ' ')) &&
          (cVar1 != '&')); uVar7 = uVar7 + 1) {
      }
      std::__cxx11::string::substr((ulong)local_70,(ulong)url);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)url);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)mp,&local_50);
      std::__cxx11::string::operator=((string *)this_00,local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string(local_70);
    }
  }
LAB_00117aa7:
  return sVar2 != 0;
}

Assistant:

bool _parseUrl(const string& url, HashMap<string, string>& mp)
            {
                if(url.empty())
                {
                    return false;
                }

                uint pos = url.find('?');
                if(string::npos == pos)
                {
                    return false;
                }
                uint kleft = 0, kright = 0;
                uint vleft = 0, vright = 0;
                for(uint i = pos + 1; i < url.size();)
                {
                    kleft = i;
                    while(i < url.size() && url[i] != '=')
                    {
                        i++;
                    }
                    if(i >= url.size())
                    {
                        break;
                    }
                    kright = i;
                    i++;
                    vleft = i;
                    while(i < url.size() && url[i] != '&' && url[i] != ' ')
                    {
                        i++;
                    }
                    vright = i;
                    mp[url.substr(kleft, kright - kleft)] = url.substr(vleft, vright - vleft);
                    i++;
                }

                return true;
            }